

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O3

char * google::protobuf::internal::TcParser::
       MpPackedVarintT<false,unsigned_int,(unsigned_short)1024>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  ulong uVar1;
  char *pcVar2;
  uint *puVar3;
  
  puVar3 = (uint *)((long)&table->has_bits_offset + ((ulong)data.field_0 >> 0x20));
  if (((ulong)puVar3 & 3) != 0) {
    AlignFail(puVar3);
  }
  uVar1 = (long)&msg->_vptr_MessageLite + (ulong)*puVar3;
  if ((uVar1 & 7) == 0) {
    pcVar2 = EpsCopyInputStream::
             ReadPackedVarint<google::protobuf::internal::TcParser::MpPackedVarintT<false,unsigned_int,(unsigned_short)1024>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(int)_1_,google::protobuf::internal::EpsCopyInputStream::ReadPackedVarint<google::protobuf::internal::TcParser::MpPackedVarintT<false,unsigned_int,(unsigned_short)1024>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(int)_1_>(char_const*,google::protobuf::internal::TcParser::MpPackedVarintT<false,unsigned_int,(unsigned_short)1024>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(int)_1_)::_lambda(int)_1_>
                       (&ctx->super_EpsCopyInputStream);
    return pcVar2;
  }
  AlignFail(uVar1);
}

Assistant:

const char* TcParser::MpPackedVarintT(PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  // For is_split we ignore the incoming xform_val and read it from entry to
  // reduce duplication for the uncommon paths.
  const uint16_t xform_val =
      is_split ? (entry.type_card & field_layout::kTvMask) : xform_val_in;
  const bool is_zigzag = xform_val == field_layout::kTvZigZag;
  const bool is_validated_enum = xform_val & field_layout::kTvEnum;

  void* const base = MaybeGetSplitBase(msg, is_split, table);
  auto* field = &MaybeCreateRepeatedFieldRefAt<FieldType, is_split>(
      base, entry.offset, msg);

  if (is_validated_enum) {
    const TcParseTableBase::FieldAux aux = *table->field_aux(entry.aux_idx);
    PrefetchEnumData(xform_val, aux);
    return ctx->ReadPackedVarint(ptr, [=](int32_t value) {
      if (!EnumIsValidAux(value, xform_val, aux)) {
        AddUnknownEnum(msg, table, data.tag(), value);
      } else {
        field->Add(value);
      }
    });
  } else {
    return ctx->ReadPackedVarint(ptr, [=](uint64_t value) {
      field->Add(is_zigzag ? (sizeof(FieldType) == 8
                                  ? WireFormatLite::ZigZagDecode64(value)
                                  : WireFormatLite::ZigZagDecode32(
                                        static_cast<uint32_t>(value)))
                           : value);
    });
  }
}